

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O0

char * SoapySDRDevice_getAntenna(SoapySDRDevice *device,int direction,size_t channel)

{
  undefined8 in_RDX;
  undefined4 in_ESI;
  long *in_RDI;
  exception *ex;
  string *in_stack_ffffffffffffffb0;
  string local_40 [32];
  undefined8 local_20;
  undefined4 local_14;
  long *local_10;
  char *local_8;
  
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  SoapySDRDevice_clearError();
  (**(code **)(*local_10 + 0xe8))(local_40,local_10,local_14,local_20);
  local_8 = toCString(in_stack_ffffffffffffffb0);
  std::__cxx11::string::~string(local_40);
  return local_8;
}

Assistant:

char *SoapySDRDevice_getAntenna(const SoapySDRDevice *device, const int direction, const size_t channel)
{
    __SOAPY_SDR_C_TRY
    return toCString(device->getAntenna(direction, channel));
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}